

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O1

void ensure_cell_count(ErrorList *errors,TableRows *rows,TableRow *header,AstNode *ast_node)

{
  wchar_t wVar1;
  Location_conflict location;
  TableRow *pTVar2;
  long lVar3;
  long lVar4;
  
  if ((rows != (TableRows *)0x0) && (rows->row_count != L'\0')) {
    pTVar2 = header;
    if (header == (TableRow *)0x0) {
      pTVar2 = rows->table_rows;
    }
    if (L'\0' < rows->row_count) {
      wVar1 = pTVar2->table_cells->cell_count;
      lVar3 = 0xc;
      lVar4 = 0;
      do {
        if (**(wchar_t **)(&rows->table_rows->field_0x14 + lVar3) != wVar1) {
          location = *(Location_conflict *)((long)&rows->table_rows->row_delete + lVar3);
          TableRow_delete(header);
          TableRows_delete(rows);
          AstNode_delete(ast_node);
          ErrorList_add_inconsisten_cell_count_error(errors,location);
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar4 < rows->row_count);
    }
  }
  return;
}

Assistant:

static void ensure_cell_count(ErrorList* errors, const TableRows* rows, const TableRow* header, AstNode* ast_node) {
    if (!rows || rows->row_count == 0) {
        return;
    }
    int cell_count = header ? header->table_cells->cell_count : rows->table_rows[0].table_cells->cell_count;
    int i;
    for (i = 0; i < rows->row_count; ++i) {
        if (rows->table_rows[i].table_cells->cell_count != cell_count) {
            Location error_location = {rows->table_rows[i].location.line, rows->table_rows[i].location.column};
            TableRow_delete(header);
            TableRows_delete(rows);
            AstNode_delete(ast_node);
            ErrorList_add_inconsisten_cell_count_error(errors, error_location);
        }
    }
}